

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addAllOfGroup<char_const(&)[7]>
          (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,char (*name) [7],bool required)

{
  Command *pCVar1;
  byte in_CL;
  API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RSI;
  API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  AllOfGroup *g;
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> group;
  pointer in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 required_00;
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *this_00;
  char (*in_stack_ffffffffffffff58) [7];
  unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *__u;
  AllOfGroup *in_stack_ffffffffffffff60;
  undefined1 local_68 [16];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_58;
  type local_48;
  undefined1 local_3d [36];
  byte local_19;
  
  required_00 = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_19 = in_CL & 1;
  operator_new(0x50);
  AllOfGroup::AllOfGroup<char_const(&)[7]>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool)required_00);
  this_00 = (unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *)local_3d;
  Deleter<Args::ArgIface>::Deleter((Deleter<Args::ArgIface> *)this_00,true);
  __u = (unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_> *)(local_3d + 0xd);
  std::unique_ptr<Args::AllOfGroup,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            (this_00,in_stack_ffffffffffffff48,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x176393);
  local_48 = std::unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_>::operator*
                       (this_00);
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::AllOfGroup,Args::details::Deleter<Args::ArgIface>,void>(&local_58,__u);
  pCVar1 = in_RSI->m_self;
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff48);
  (*(pCVar1->super_GroupIface).super_ArgIface._vptr_ArgIface[0x13])(pCVar1,local_68);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  ::API(in_RDI,in_RSI,local_48);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::AllOfGroup,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr(this_00);
  return in_RDI;
}

Assistant:

API< API< PARENT, Command, ARGPTR, false >, AllOfGroup, ARGPTR, false > addAllOfGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< AllOfGroup, details::Deleter< ArgIface > > (
			new AllOfGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		AllOfGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< API< PARENT, Command, ARGPTR, false >, AllOfGroup, ARGPTR, false >
			( *this, g );
	}